

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

defV * __thiscall
helics::readJsonValue_abi_cxx11_(defV *__return_storage_ptr__,helics *this,data_view *data)

{
  value_t vVar1;
  array_t *paVar2;
  string_view typeName;
  undefined8 uVar3;
  bool bVar4;
  DataType DVar5;
  reference pvVar6;
  size_t sVar7;
  reference pvVar8;
  reference j;
  iterator iVar9;
  undefined1 *puVar10;
  _Alloc_hider _Var11;
  ulong idx;
  string_view jsonString;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> res;
  long ret;
  json json;
  vector<double,_std::allocator<double>_> res_1;
  _Alloc_hider local_b8;
  iterator in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined8 uVar12;
  undefined1 local_90 [24];
  primitive_iterator_t local_78;
  data local_70;
  reference local_60;
  vector<double,_std::allocator<double>_> local_58;
  reference local_38;
  
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ).
    super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    .
    super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
    ._M_u = 0;
  (__return_storage_ptr__->
  super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ).
  super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  .
  super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
  ._M_index = '\0';
  jsonString._M_str = *(char **)this;
  jsonString._M_len = (size_t)&local_70;
  fileops::loadJsonStr_abi_cxx11_(jsonString);
  pvVar6 = nlohmann::json_abi_v3_11_3::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                       *)&local_70,"type");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_b8,pvVar6);
  typeName._M_str = (char *)in_stack_ffffffffffffff58;
  typeName._M_len = (size_t)in_stack_ffffffffffffff50._M_node;
  DVar5 = getTypeFromString(typeName);
  if ((reference)local_b8._M_p != (reference)&stack0xffffffffffffff58) {
    operator_delete(local_b8._M_p,(ulong)(in_stack_ffffffffffffff58 + 1));
  }
  switch(DVar5) {
  case HELICS_STRING:
  case HELICS_CHAR:
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_70,"value");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_b8,pvVar6);
    break;
  case HELICS_DOUBLE:
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_70,"value");
    local_90._0_8_ = (reference)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
              (pvVar6,(double *)local_90);
    local_b8._M_p = (pointer)local_90._0_8_;
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)__return_storage_ptr__,(double *)&local_b8);
    goto LAB_00217342;
  case HELICS_INT:
  case HELICS_TIME:
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_70,"value");
    local_90._0_8_ = (reference)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_long,_0>
              (pvVar6,(long *)local_90);
    local_b8._M_p = (pointer)local_90._0_8_;
    goto LAB_00216eb7;
  case HELICS_COMPLEX:
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_70,"value");
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[](pvVar6,0);
    local_90._0_8_ = (reference)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
              (pvVar6,(double *)local_90);
    uVar12 = local_90._0_8_;
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_70,"value");
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             ::operator[](pvVar6,1);
    local_90._0_8_ = (reference)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
              (pvVar6,(double *)local_90);
    local_b8._M_p = (pointer)uVar12;
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)__return_storage_ptr__,(complex<double> *)&local_b8);
    goto LAB_00217342;
  case HELICS_VECTOR:
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (double *)0x0;
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (double *)0x0;
    local_b8._M_p =
         (pointer)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_70,"value");
    iVar9._M_node = (_Rb_tree_node_base *)0x0;
    vVar1 = (((reference)local_b8._M_p)->m_data).m_type;
    if (vVar1 == null) {
LAB_00217247:
      local_90._8_8_ = (_Base_ptr)0x0;
      local_90._16_8_ = (pointer)0x0;
      local_78.m_it = 1;
    }
    else if (vVar1 == array) {
      local_90._8_8_ = (_Base_ptr)0x0;
      local_78.m_it = -0x8000000000000000;
      local_90._16_8_ =
           (((((reference)local_b8._M_p)->m_data).m_value.array)->
           super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      if (vVar1 != object) goto LAB_00217247;
      iVar9._M_node = (_Base_ptr)((((reference)local_b8._M_p)->m_data).m_value.binary)->m_subtype;
      local_90._16_8_ = (pointer)0x0;
      local_78.m_it = -0x8000000000000000;
      local_90._8_8_ =
           &(((((reference)local_b8._M_p)->m_data).m_value.object)->_M_t)._M_impl.
            super__Rb_tree_header;
    }
    local_90._0_8_ = local_b8._M_p;
    while (bVar4 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_b8,
                              (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)local_90), !bVar4) {
      j = nlohmann::json_abi_v3_11_3::detail::
          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
          ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                       *)&local_b8);
      local_60 = (reference)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                (j,(double *)&local_60);
      local_38 = local_60;
      if (local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_38);
      }
      else {
        *local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)local_60;
        local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      if ((*local_b8._M_p != '\x02') && (*local_b8._M_p == '\x01')) {
        iVar9._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar9._M_node);
      }
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)__return_storage_ptr__,&local_58);
    _Var11._M_p = (pointer)local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
    uVar12 = local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    goto joined_r0x002171f5;
  case HELICS_COMPLEX_VECTOR:
    local_b8._M_p = (pointer)0x0;
    uVar12 = (double *)0x0;
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_70,"value");
    idx = 0;
    while( true ) {
      vVar1 = (pvVar6->m_data).m_type;
      sVar7 = (size_t)vVar1;
      if (vVar1 != null) {
        if (vVar1 == object) {
          sVar7 = (((pvVar6->m_data).m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                  _M_node_count;
        }
        else if (vVar1 == array) {
          paVar2 = (pvVar6->m_data).m_value.array;
          sVar7 = (long)(paVar2->
                        super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(paVar2->
                        super__Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 4;
        }
        else {
          sVar7 = 1;
        }
      }
      if (sVar7 - 1 <= idx) break;
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](pvVar6,idx);
      local_90._0_8_ = (reference)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                (pvVar8,(double *)local_90);
      local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_90._0_8_;
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
               ::operator[](pvVar6,idx + 1);
      local_90._0_8_ = (reference)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
                (pvVar8,(double *)local_90);
      local_60 = (reference)local_90._0_8_;
      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
      emplace_back<double,double>
                ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)&local_b8,
                 (double *)&local_58,(double *)&local_60);
      idx = idx + 2;
    }
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)__return_storage_ptr__,
                (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_b8);
    _Var11._M_p = local_b8._M_p;
joined_r0x002171f5:
    if ((reference)_Var11._M_p == (reference)0x0) goto LAB_00217342;
    puVar10 = (undefined1 *)(uVar12 - (long)_Var11._M_p);
    goto LAB_0021733d;
  case HELICS_NAMED_POINT:
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_70,"name");
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (local_90,pvVar6);
    uVar3 = local_90._8_8_;
    uVar12 = local_90._0_8_;
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_70,"value");
    local_58.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    nlohmann::json_abi_v3_11_3::detail::
    get_arithmetic_value<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_double,_0>
              (pvVar6,(double *)&local_58);
    local_b8._M_p = (pointer)&stack0xffffffffffffff58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,uVar12,
               (value_t *)
               ((long)&((_Rb_tree_node_base *)uVar3)->_M_color + (long)&((data *)uVar12)->m_type));
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)__return_storage_ptr__,(NamedPoint *)&local_b8);
    if ((reference)local_b8._M_p != (reference)&stack0xffffffffffffff58) {
      operator_delete(local_b8._M_p,(ulong)(in_stack_ffffffffffffff58 + 1));
    }
    in_stack_ffffffffffffff58 = local_90._16_8_;
    _Var11._M_p = (pointer)local_90._0_8_;
    if ((reference)local_90._0_8_ == (reference)(local_90 + 0x10)) goto LAB_00217342;
    goto LAB_002171d5;
  case HELICS_BOOL:
    pvVar6 = nlohmann::json_abi_v3_11_3::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                         *)&local_70,"value");
    local_90._0_8_ = local_90._0_8_ & 0xffffffffffffff00;
    nlohmann::json_abi_v3_11_3::detail::
    from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              (pvVar6,(boolean_t *)local_90);
    local_b8._M_p = (pointer)(local_90._0_8_ & 0xff);
LAB_00216eb7:
    std::
    variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
    ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                 *)__return_storage_ptr__,(long *)&local_b8);
    goto LAB_00217342;
  default:
    local_b8._M_p = (pointer)&stack0xffffffffffffff58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,*(long *)(this + 8),*(long *)this + *(long *)(this + 8));
  }
  std::
  variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
  ::operator=((variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
               *)__return_storage_ptr__,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8);
  _Var11._M_p = local_b8._M_p;
  if ((reference)local_b8._M_p != (reference)&stack0xffffffffffffff58) {
LAB_002171d5:
    puVar10 = &(((pointer)in_stack_ffffffffffffff58)->m_data).field_0x1;
LAB_0021733d:
    operator_delete(_Var11._M_p,(ulong)puVar10);
  }
LAB_00217342:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_70);
  return __return_storage_ptr__;
}

Assistant:

defV readJsonValue(const data_view& data)
{
    defV result;
    try {
        auto json = fileops::loadJsonStr(data.string_view());
        switch (getTypeFromString(json["type"].get<std::string>())) {
            case DataType::HELICS_DOUBLE:
                result = json["value"].get<double>();
                break;
            case DataType::HELICS_COMPLEX:
                result = std::complex<double>(json["value"][0].get<double>(),
                                              json["value"][1].get<double>());
                break;
            case DataType::HELICS_BOOL:
                result = static_cast<std::int64_t>(json["value"].get<bool>());
                break;
            case DataType::HELICS_VECTOR: {
                std::vector<double> res;
                for (const auto& value : json["value"]) {
                    res.push_back(value.get<double>());
                }
                result = std::move(res);
            } break;
            case DataType::HELICS_COMPLEX_VECTOR: {
                std::vector<std::complex<double>> res;
                auto& array = json["value"];
                for (std::size_t ii = 0; ii < array.size() - 1; ii += 2) {
                    res.emplace_back(array[ii].get<double>(), array[ii + 1].get<double>());
                }
                result = std::move(res);
            } break;
            case DataType::HELICS_INT:
            case DataType::HELICS_TIME:
                result = json["value"].get<int64_t>();
                break;
            case DataType::HELICS_STRING:
            case DataType::HELICS_CHAR:
                result = json["value"].get<std::string>();
                break;
            case DataType::HELICS_NAMED_POINT:
                result = NamedPoint(json["name"].get<std::string>(), json["value"].get<double>());
                break;
            case DataType::HELICS_MULTI:
            default:
                result = data.string();
        }
    }
    catch (...) {
        result = data.string();
    }
    return result;
}